

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageSparseResidency.cpp
# Opt level: O0

UVec3 __thiscall
vkt::sparse::anon_unknown_4::computeWorkGroupSize(anon_unknown_4 *this,UVec3 *gridSize)

{
  uint *puVar1;
  uint extraout_EDX;
  UVec3 UVar2;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  deUint32 zWorkGroupSize;
  uint local_3c;
  uint local_38;
  uint local_34;
  deUint32 yWorkGroupSize;
  uint local_2c;
  undefined1 local_28 [4];
  deUint32 xWorkGroupSize;
  UVec3 maxComputeWorkGroupSize;
  deUint32 maxComputeWorkGroupInvocations;
  UVec3 *gridSize_local;
  
  maxComputeWorkGroupSize.m_data[1] = 0x80;
  unique0x1000019e = gridSize;
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)local_28,0x80,0x80,0x40);
  yWorkGroupSize = tcu::Vector<unsigned_int,_3>::x(stack0xffffffffffffffe8);
  local_34 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_28);
  puVar1 = std::min<unsigned_int>(&yWorkGroupSize,&local_34);
  puVar1 = std::min<unsigned_int>(puVar1,maxComputeWorkGroupSize.m_data + 1);
  local_2c = *puVar1;
  local_3c = tcu::Vector<unsigned_int,_3>::y(stack0xffffffffffffffe8);
  zWorkGroupSize = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_28);
  puVar1 = std::min<unsigned_int>(&local_3c,&zWorkGroupSize);
  local_44 = (uint)(0x80 / (ulong)local_2c);
  puVar1 = std::min<unsigned_int>(puVar1,&local_44);
  local_38 = *puVar1;
  local_4c = tcu::Vector<unsigned_int,_3>::z(stack0xffffffffffffffe8);
  local_50 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_28);
  puVar1 = std::min<unsigned_int>(&local_4c,&local_50);
  local_54 = (uint)(0x80 / (ulong)(local_2c * local_38));
  puVar1 = std::min<unsigned_int>(puVar1,&local_54);
  local_48 = *puVar1;
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,local_2c,local_38,local_48);
  UVar2.m_data[2] = extraout_EDX;
  UVar2.m_data._0_8_ = this;
  return (UVec3)UVar2.m_data;
}

Assistant:

tcu::UVec3 computeWorkGroupSize (const tcu::UVec3& gridSize)
{
	const deUint32		maxComputeWorkGroupInvocations	= 128u;
	const tcu::UVec3	maxComputeWorkGroupSize			= tcu::UVec3(128u, 128u, 64u);

	const deUint32 xWorkGroupSize = std::min(std::min(gridSize.x(), maxComputeWorkGroupSize.x()), maxComputeWorkGroupInvocations);
	const deUint32 yWorkGroupSize = std::min(std::min(gridSize.y(), maxComputeWorkGroupSize.y()), maxComputeWorkGroupInvocations /  xWorkGroupSize);
	const deUint32 zWorkGroupSize = std::min(std::min(gridSize.z(), maxComputeWorkGroupSize.z()), maxComputeWorkGroupInvocations / (xWorkGroupSize*yWorkGroupSize));

	return tcu::UVec3(xWorkGroupSize, yWorkGroupSize, zWorkGroupSize);
}